

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointPoint::IntLoadConstraint_C
          (ChLinkPointPoint *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_48 [16];
  double local_38;
  
  iVar4 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    peVar1 = (this->mnodeA).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2 = (this->mnodeB).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar6 = vsubpd_avx(*(undefined1 (*) [16])&peVar1->field_0x28,
                        *(undefined1 (*) [16])&peVar2->field_0x28);
    local_38 = (*(double *)&(peVar1->super_ChNodeFEAbase).field_0x20 -
               *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20) * c;
    local_48._0_8_ = auVar6._0_8_ * c;
    local_48._8_8_ = auVar6._8_8_ * c;
    if (do_clamp) {
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = recovery_clamp;
      auVar7._8_8_ = recovery_clamp;
      auVar7._0_8_ = recovery_clamp;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar6 = vxorpd_avx512vl(auVar7,auVar6);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_38;
      auVar9 = vmaxsd_avx(auVar9,auVar6);
      auVar8._0_8_ = auVar6._0_8_;
      auVar8._8_8_ = auVar8._0_8_;
      auVar6 = vmaxpd_avx(local_48,auVar8);
      auVar9 = vminsd_avx(auVar9,auVar3);
      local_38 = auVar9._0_8_;
      local_48 = vminpd_avx(auVar6,auVar7);
    }
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)off_L);
    *pSVar5 = local_38 + *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 1));
    *pSVar5 = (double)local_48._0_8_ + *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 2));
    auVar6 = vpermilpd_avx(local_48,1);
    *pSVar5 = auVar6._0_8_ + *pSVar5;
  }
  return;
}

Assistant:

void ChLinkPointPoint::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                           ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                           const double c,            // a scaling factor
                                           bool do_clamp,             // apply clamping to c*C?
                                           double recovery_clamp      // value for min/max clamping of c*C
                                           ) {
    if (!IsActive())
        return;

    ChVector<> res = mnodeA->GetPos() - mnodeB->GetPos();
    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cres.x();
    Qc(off_L + 1) += cres.y();
    Qc(off_L + 2) += cres.z();
}